

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

bool __thiscall slang::ast::SubroutineSymbol::hasOutputArgs(SubroutineSymbol *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ArgList AVar4;
  
  if ((this->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x100;
    AVar4 = getArguments(this);
    for (lVar3 = 0; AVar4._M_extent._M_extent_value._M_extent_value * 8 != lVar3; lVar3 = lVar3 + 8)
    {
      lVar2 = *(long *)((long)AVar4._M_ptr + lVar3);
      iVar1 = *(int *)(lVar2 + 0x158);
      if ((iVar1 != 0) && ((iVar1 != 3 || ((*(byte *)(lVar2 + 0x154) & 1) == 0)))) {
        (this->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
        break;
      }
    }
  }
  return (this->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
         super__Optional_payload_base<bool>._M_payload._M_value;
}

Assistant:

bool SubroutineSymbol::hasOutputArgs() const {
    if (!cachedHasOutputArgs.has_value()) {
        cachedHasOutputArgs = false;
        for (auto arg : getArguments()) {
            if (arg->direction != ArgumentDirection::In &&
                (arg->direction != ArgumentDirection::Ref ||
                 !arg->flags.has(VariableFlags::Const))) {
                cachedHasOutputArgs = true;
                break;
            }
        }
    }
    return *cachedHasOutputArgs;
}